

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall tinyusdz::Attribute::set_value<tinyusdz::Token>(Attribute *this,Token *v)

{
  ulong uVar1;
  string local_38 [32];
  Token *local_18;
  Token *v_local;
  Attribute *this_local;
  
  local_18 = v;
  v_local = (Token *)this;
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
    ::std::__cxx11::string::operator=((string *)&this->_type_name,local_38);
    ::std::__cxx11::string::~string(local_38);
  }
  primvar::PrimVar::set_value<tinyusdz::Token>(&this->_var,local_18);
  return;
}

Assistant:

void set_value(const T &v) {
    if (_type_name.empty()) {
      _type_name = value::TypeTraits<T>::type_name();
    }
    _var.set_value(v);
  }